

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O3

void helper_bpt_io_x86_64(CPUX86State *env,uint32_t port,uint32_t size,target_ulong next_eip)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  
  uVar1 = env->dr[7];
  lVar4 = 0;
  lVar7 = 0xa7c;
  uVar5 = 0;
  uVar6 = 0;
  do {
    if (((((uint)(uVar1 >> ((char)lVar7 + 0x94U & 0x3f)) & 3) == 2) &&
        (((1L << ((byte)lVar4 & 0x3f) | 2L << ((byte)lVar4 & 0x3f)) & uVar1) != 0)) &&
       (uVar2 = *(ulong *)((long)env->regs + lVar7 * 2), uVar2 <= (port + size) - 1)) {
      uVar8 = (uint)(uVar1 >> ((char)lVar7 + 0x96U & 0x3f)) & 3;
      uVar3 = (ulong)(uVar8 + 1);
      if (uVar8 == 2) {
        uVar3 = 8;
      }
      if ((ulong)port <= (uVar3 + uVar2) - 1) {
        uVar6 = uVar6 | 1 << (uVar5 & 0x1f);
      }
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 4;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 8);
  if (uVar6 == 0) {
    return;
  }
  env->dr[6] = (long)(int)uVar6 | env->dr[6] & 0xfffffffffffffff0;
  env->eip = next_eip;
  raise_exception_x86_64(env,1);
}

Assistant:

void helper_bpt_io(CPUX86State *env, uint32_t port,
                   uint32_t size, target_ulong next_eip)
{
    target_ulong dr7 = env->dr[7];
    int i, hit = 0;

    for (i = 0; i < DR7_MAX_BP; ++i) {
        if (hw_breakpoint_type(dr7, i) == DR7_TYPE_IO_RW
            && hw_breakpoint_enabled(dr7, i)) {
            int bpt_len = hw_breakpoint_len(dr7, i);
            if (port + size - 1 >= env->dr[i]
                && port <= env->dr[i] + bpt_len - 1) {
                hit |= 1 << i;
            }
        }
    }

    if (hit) {
        env->dr[6] = (env->dr[6] & ~0xf) | hit;
        env->eip = next_eip;
        raise_exception(env, EXCP01_DB);
    }
}